

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall kws::Parser::FindFunction(Parser *this,size_t pos,char *buffer)

{
  char cVar1;
  pointer pcVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  Parser *this_00;
  bool bVar12;
  string buf;
  undefined1 *local_a8;
  char *local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  size_t local_80;
  Parser *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a8 = local_98;
  pcVar2 = (this->m_BufferNoComment)._M_dataplus._M_p;
  local_78 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + (this->m_BufferNoComment)._M_string_length);
  pcVar6 = local_a0;
  if (buffer != (char *)0x0) {
    strlen(buffer);
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,pcVar6,(ulong)buffer);
  }
  sVar7 = 0xffffffffffffffff;
  if ((pos != 0xffffffffffffffff) && (pos <= local_a0 + -1)) {
    sVar7 = std::__cxx11::string::find((char)&local_a8,0x7d);
    this_00 = local_78;
    do {
      if (sVar7 == 0xffffffffffffffff) {
        sVar7 = 0xffffffffffffffff;
        goto LAB_001242f9;
      }
      sVar8 = FindOpeningChar(this_00,'}','{',sVar7,true);
      if (sVar8 == 0xffffffffffffffff) {
        iVar10 = 3;
        sVar8 = local_80;
      }
      else {
        bVar4 = true;
        bVar12 = sVar8 == 0;
        if (!bVar12) {
          bVar5 = true;
          bVar4 = true;
          sVar3 = sVar8;
          do {
            sVar11 = sVar3 - 1;
            cVar1 = local_a8[sVar11];
            if ((cVar1 != '\r') && (cVar1 != ' ')) {
              if (cVar1 == ')') break;
              bVar4 = bVar5;
              if (cVar1 != '\n') {
                bVar5 = false;
                bVar4 = false;
              }
            }
            bVar12 = sVar3 == 1;
            sVar3 = sVar11;
          } while (sVar11 != 0);
        }
        iVar10 = 1;
        if (!bVar4) {
          if (!bVar12) {
            std::__cxx11::string::substr((ulong)local_70,(ulong)&local_a8);
            local_88 = 0;
            lVar9 = std::__cxx11::string::find((char *)local_70,0x16b7b7,0);
            this_00 = local_78;
            if (lVar9 == -1) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)&local_a8);
              lVar9 = std::__cxx11::string::find((char *)local_50,0x16f763,0);
              this_00 = local_78;
              local_88 = CONCAT71((int7)((ulong)lVar9 >> 8),lVar9 != -1);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            if ((char)local_88 != '\0') goto LAB_001242d7;
          }
          sVar7 = std::__cxx11::string::find((char)&local_a8,0x7d);
          iVar10 = 0;
          sVar8 = local_80;
        }
      }
LAB_001242d7:
      local_80 = sVar8;
    } while (iVar10 == 0);
    sVar7 = 0xffffffffffffffff;
    if (iVar10 != 3) {
      sVar7 = local_80;
    }
  }
LAB_001242f9:
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return sVar7;
}

Assistant:

size_t Parser::FindFunction(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;

  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return std::string::npos;
    }

  // a function is defined as:
  // function() [const] {}; and if() {} is considered as a function
  // here.

  // We go backwards
  size_t end = buf.find('}',pos);
  while(end != std::string::npos)
    {
    size_t beg = this->FindOpeningChar('}','{',end,true);
    if(beg == std::string::npos)
        {
        break;
        }

    // check that before the beg we have
    bool nospecialchar=true;
    size_t i = beg-1;
    while(i != std::string::npos)
      {
      if(buf[i] == ')')
        {
        break;
        }
      else if(
        buf[i] != ' ' && buf[i] != '\r'
        && buf[i] != '\n'
        )
        {
        nospecialchar = false;
        }
      --i;
      }

    if(nospecialchar)
      {
      return beg;
      }
    if(i != std::string::npos)// check if we have a const
      {
      if(buf.substr(i,beg-i).find("]") == std::string::npos &&
         buf.substr(i,beg-i).find("const") != std::string::npos
        )
        {
        return beg;
        }
      }
    end = buf.find('}',end+1);
    }

  return std::string::npos;
}